

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O1

char * Io_ReadDsdFindEnd(char *pCur)

{
  char cVar1;
  int iVar2;
  
  if (*pCur != '(') {
    __assert_fail("*pCur == \'(\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadDsd.c"
                  ,0x31,"char *Io_ReadDsdFindEnd(char *)");
  }
  iVar2 = 0;
  while( true ) {
    cVar1 = *pCur;
    if (cVar1 == '(') {
      iVar2 = iVar2 + 1;
    }
    else if (cVar1 == ')') {
      iVar2 = iVar2 + -1;
    }
    else if (cVar1 == '\0') {
      return (char *)0x0;
    }
    if (iVar2 == 0) break;
    pCur = pCur + 1;
  }
  return pCur;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds the end of the part.]

  Description []
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Io_ReadDsdFindEnd( char * pCur )
{
    char * pEnd;
    int nParts = 0;
    assert( *pCur == '(' );
    for ( pEnd = pCur; *pEnd; pEnd++ )
    {
        if ( *pEnd == '(' )
            nParts++;
        else if ( *pEnd == ')' )
            nParts--;
        if ( nParts == 0 )
            return pEnd;
    }
    return NULL;
}